

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifexec(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  runsdef *prVar2;
  objnum dobj;
  objnum prep;
  objnum iobj;
  mcmon objnum;
  uint uVar3;
  int iVar4;
  runcxdef *prVar5;
  uchar *s;
  objnum verb;
  objnum actor;
  ulong uVar6;
  uint orig_size;
  int *rem_argc;
  int local_16c;
  errdef fr_;
  
  prVar5 = ctx->bifcxrun;
  if (argc - 7U < 0xfffffffb) {
    prVar5->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x401);
  }
  prVar1 = prVar5->runcxsp;
  prVar5->runcxsp = prVar1 + -1;
  prVar5 = ctx->bifcxrun;
  prVar2 = prVar5->runcxsp;
  if (prVar1[-1].runstyp == '\x02') {
    actor = (prVar2->runsv).runsvobj;
  }
  else {
    actor = 0xffff;
    if (prVar2->runstyp != '\x05') goto LAB_00211e9b;
  }
  prVar5->runcxsp = prVar2 + -1;
  prVar5 = ctx->bifcxrun;
  if (prVar2[-1].runstyp == '\x02') {
    verb = (prVar5->runcxsp->runsv).runsvobj;
  }
  else {
    verb = 0xffff;
    if (prVar5->runcxsp->runstyp != '\x05') {
LAB_00211e9b:
      prVar5->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3f2);
    }
  }
  local_16c = argc + -2;
  rem_argc = &local_16c;
  dobj = bif_get_optional_obj_arg(ctx,rem_argc);
  prep = bif_get_optional_obj_arg(ctx,rem_argc);
  iobj = bif_get_optional_obj_arg(ctx,rem_argc);
  if (local_16c < 1) {
    uVar6 = 0;
    iVar4 = local_16c;
  }
  else {
    prVar1 = ctx->bifcxrun->runcxsp;
    ctx->bifcxrun->runcxsp = prVar1 + -1;
    if (prVar1[-1].runstyp != '\x01') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    uVar6 = (ctx->bifcxrun->runcxsp->runsv).runsvnum;
    iVar4 = local_16c + -1;
  }
  if (iVar4 != 0) {
    ctx->bifcxrun->runcxerr->errcxptr->erraav[0].errastr = "execCommand";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x3ff);
  }
  prVar5 = ctx->bifcxrun;
  if ((uVar6 & 3) != 0) {
    tiocapture(ctx->bifcxtio,prVar5->runcxmem,1);
    uVar3 = tiocapturesize(ctx->bifcxtio);
    rem_argc = (int *)(ulong)uVar3;
    prVar5 = ctx->bifcxrun;
  }
  iVar4 = execmd_recurs(prVar5->runcxvoc,actor,verb,dobj,prep,iobj,(uint)((uVar6 & 4) == 0),
                        (uint)((uVar6 & 8) == 0));
  if ((uVar6 & 3) != 0) {
    uVar3 = tiocapturesize(ctx->bifcxtio);
    orig_size = (uint)rem_argc;
    if (orig_size == 0) {
      tiocapture(ctx->bifcxtio,ctx->bifcxrun->runcxmem,0);
    }
    if (((uint)uVar6 >> (iVar4 != 0) & 1) == 0) {
      if (orig_size != 0) goto LAB_00211e65;
      objnum = tiogetcapture(ctx->bifcxtio);
      s = mcmlck(ctx->bifcxrun->runcxmem,objnum);
      fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
      if (fr_.errcode != 0) {
        ctx->bifcxerr->errcxptr = fr_.errprv;
        mcmunlck(ctx->bifcxrun->runcxmem,objnum);
        errrse1(ctx->bifcxerr,&fr_);
      }
      fr_.errprv = ctx->bifcxerr->errcxptr;
      ctx->bifcxerr->errcxptr = &fr_;
      outformatlen((char *)s,uVar3);
      ctx->bifcxerr->errcxptr = fr_.errprv;
      mcmunlck(ctx->bifcxrun->runcxmem,objnum);
    }
    else if (orig_size != 0) {
      tiopopcapture(ctx->bifcxtio,orig_size);
      goto LAB_00211e65;
    }
    tioclrcapture(ctx->bifcxtio);
  }
LAB_00211e65:
  runpnum(ctx->bifcxrun,(long)iVar4);
  return;
}

Assistant:

void bifexec(bifcxdef *ctx, int argc)
{
    objnum actor;
    objnum verb;
    objnum dobj;
    objnum prep;
    objnum iobj;
    int    err;
    uint   capture_start;
    uint   capture_end;
    objnum capture_obj;
    ulong  flags;
    int    hide_any;
    int    rem_argc;
    
    /* 
     *   Check for the correct argument count.  The first two arguments
     *   are required; additional arguments are optional. 
     */
    if (argc < 2 || argc > 6)
        runsig(ctx->bifcxrun, ERR_BIFARGC);

    /* pop the arguments - actor, verb, dobj, prep, iobj */
    actor = runpopobjnil(ctx->bifcxrun);
    verb = runpopobjnil(ctx->bifcxrun);

    /* 
     *   The other object arguments are optional.  If we run into a
     *   numeric argument, it's the flags value, in which case we're out
     *   of objects. 
     */
    rem_argc = argc - 2;
    dobj = bif_get_optional_obj_arg(ctx, &rem_argc);
    prep = bif_get_optional_obj_arg(ctx, &rem_argc);
    iobj = bif_get_optional_obj_arg(ctx, &rem_argc);

    /* if we have a flags argument, pop it */
    if (rem_argc > 0)
    {
        /* the last argument is the flags - pop the numeric value */
        flags = runpopnum(ctx->bifcxrun);

        /* remove it from the remaining argument counter */
        --rem_argc;
    }
    else
    {
        /* no flags specified - use zero by default */
        flags = 0;
    }

    /* 
     *   make sure we don't have any arguments left - if we do, then it
     *   means that we got an incorrect type and skipped an argument when
     *   we were trying to sense the meanings of the arguments from their
     *   types 
     */
    if (rem_argc != 0)
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "execCommand");

    /* if we're hiding any output, start output capture */
    hide_any = ((flags & (EC_HIDE_SUCCESS | EC_HIDE_ERROR)) != 0);
    if (hide_any)
    {
        /* start capturing */
        tiocapture(ctx->bifcxtio, ctx->bifcxrun->runcxmem, TRUE);

        /* note the current output position */
        capture_start = tiocapturesize(ctx->bifcxtio);
    }

    /* execute the command */
    err = execmd_recurs(ctx->bifcxrun->runcxvoc,
                        actor, verb, dobj, prep, iobj,
                        (flags & EC_SKIP_VALIDDO) == 0,
                        (flags & EC_SKIP_VALIDIO) == 0);

    /* if we're hiding any output, end hiding */
    if (hide_any)
    {
        uchar *p;
        int hide;
        
        /* get the capture buffer size */
        capture_end = tiocapturesize(ctx->bifcxtio);

        /* turn off capture if it wasn't already on when we started */
        if (capture_start == 0)
            tiocapture(ctx->bifcxtio, ctx->bifcxrun->runcxmem, FALSE);

        /* determine whether we're hiding or showing the result */
        if (err == 0)
            hide = ((flags & EC_HIDE_SUCCESS) != 0);
        else
            hide = ((flags & EC_HIDE_ERROR) != 0);

        /* show or hide the result, as appropriate */
        if (hide)
        {
            /* 
             *   We're hiding this result, so do not display the string.
             *   If there's an enclosing capture, remove the string from
             *   the enclosing capture.  
             */
            if (capture_start != 0)
                tiopopcapture(ctx->bifcxtio, capture_start);
        }
        else
        {
            /* 
             *   We're showing the text.  If we're in an enclosing
             *   capture, do nothing - simply leave the string in the
             *   enclosing capture buffer; otherwise, actually display it 
             */
            if (capture_start == 0)
            {
                /* lock the capture object */
                capture_obj = tiogetcapture(ctx->bifcxtio);
                p = mcmlck(ctx->bifcxrun->runcxmem, capture_obj);
                
                ERRBEGIN(ctx->bifcxerr)
                {
                    /* display the string */
                    outformatlen((char *)p + capture_start,
                                 capture_end - capture_start);
                }
                ERRCLEAN(ctx->bifcxerr)
                {
                    /* unlock the capture object before signalling out */
                    mcmunlck(ctx->bifcxrun->runcxmem, capture_obj);
                }
                ERRENDCLN(ctx->bifcxerr);

                /* unlock the capture object */
                mcmunlck(ctx->bifcxrun->runcxmem, capture_obj);
            }
        }
        
        /* clear the capture buffer if it wasn't on when we started */
        if (capture_start == 0)
            tioclrcapture(ctx->bifcxtio);
    }

    /* push the result code */
    runpnum(ctx->bifcxrun, err);
}